

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall
cs::statement_default::statement_default
          (statement_default *this,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b,context_t *c,
          token_base *ptr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  statement_block *this_00;
  context_t *size;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> _Stack_98;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_88;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_78;
  
  size = c;
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_pi = local_88._M_refcount._M_pi;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_0023f558;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88._M_ptr;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  local_88._M_ptr = (element_type *)0x0;
  (this->super_statement_base).line_num = ptr->line_num;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_00242170;
  this_00 = (statement_block *)statement_base::operator_new((statement_base *)0x70,(size_t)size);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_78,b);
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_98,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  statement_block::statement_block
            (this_00,(deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_78
             ,(context_t *)&_Stack_98,ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_78);
  this->mBlock = this_00;
  return;
}

Assistant:

statement_default(const std::deque<statement_base *> &b, const context_t &c, token_base *ptr) : statement_base(
			    c, ptr),
			mBlock(new statement_block(
			           b, c,
			           ptr)) {}